

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

string * __thiscall deci::ast_while_t::EndLocationTag_abi_cxx11_(ast_while_t *this)

{
  int iVar1;
  
  if (EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_);
    if (iVar1 != 0) {
      EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_._M_dataplus._M_p =
           (pointer)&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_,"while","");
      __cxa_atexit(std::__cxx11::string::~string,&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_);
    }
  }
  return &EndLocationTag[abi:cxx11]()::whileText_abi_cxx11_;
}

Assistant:

const std::string &ast_while_t::EndLocationTag() const 
  {
    static const std::string whileText("while");
    return whileText;
  }